

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O0

void __thiscall BaseComponent::Run(BaseComponent *this)

{
  bool bVar1;
  reference ppEVar2;
  BaseStoppable *in_RDI;
  Event *ev;
  value_type in_stack_ffffffffffffffe0;
  
  (*(in_RDI->super_BaseThread)._vptr_BaseThread[1])();
  while (bVar1 = BaseStoppable::Stopping(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = std::mutex::try_lock((mutex *)in_stack_ffffffffffffffe0);
    if (bVar1) {
      bVar1 = std::queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_>::empty
                        ((queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_> *)0x108186)
      ;
      if (bVar1) {
        std::mutex::unlock((mutex *)0x10819d);
      }
      else {
        ppEVar2 = std::queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_>::front
                            ((queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_> *)
                             0x1081ad);
        in_stack_ffffffffffffffe0 = *ppEVar2;
        std::queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_>::pop
                  ((queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_> *)0x1081c3);
        std::mutex::unlock((mutex *)0x1081d4);
        (*(in_RDI->super_BaseThread)._vptr_BaseThread[3])(in_RDI,in_stack_ffffffffffffffe0);
        if (in_stack_ffffffffffffffe0 != (value_type)0x0) {
          (*in_stack_ffffffffffffffe0->_vptr_Event[1])();
        }
      }
    }
    (*(in_RDI->super_BaseThread)._vptr_BaseThread[2])();
  }
  (*(in_RDI->super_BaseThread)._vptr_BaseThread[4])();
  return;
}

Assistant:

void BaseComponent::Run() {
    Init();

    while(!Stopping()) {
        if(queueLock.try_lock()) {
            if(queue.empty()) {
                queueLock.unlock();
            } else {
                Event *ev = queue.front();
                queue.pop();

                queueLock.unlock();

                Handler(ev);
                delete ev;
            }
        }

        Process();
    }

    End();
}